

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O3

ebml_integer * CopyInt(ebml_integer *Element)

{
  filepos_t fVar1;
  ebml_integer *peVar2;
  
  peVar2 = (ebml_integer *)EBML_ElementCreate(Element,(Element->Base).Context,0,-1);
  if (peVar2 != (ebml_integer *)0x0) {
    peVar2->Value = Element->Value;
    (peVar2->Base).bValueIsSet = (Element->Base).bValueIsSet;
    fVar1 = (Element->Base).ElementPosition;
    (peVar2->Base).DataSize = (Element->Base).DataSize;
    (peVar2->Base).ElementPosition = fVar1;
    (peVar2->Base).SizeLength = (Element->Base).SizeLength;
    fVar1 = (Element->Base).EndPosition;
    (peVar2->Base).SizePosition = (Element->Base).SizePosition;
    (peVar2->Base).EndPosition = fVar1;
    (peVar2->Base).bNeedDataSizeUpdate = (Element->Base).bNeedDataSizeUpdate;
  }
  return peVar2;
}

Assistant:

static ebml_integer *CopyInt(const ebml_integer *Element)
{
    ebml_integer *Result = (ebml_integer*)EBML_ElementCreate(Element,Element->Base.Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        Result->Value = Element->Value;
        Result->Base.bValueIsSet = Element->Base.bValueIsSet;
        Result->Base.DataSize = Element->Base.DataSize;
        Result->Base.ElementPosition = Element->Base.ElementPosition;
        Result->Base.SizeLength = Element->Base.SizeLength;
        Result->Base.SizePosition = Element->Base.SizePosition;
        Result->Base.EndPosition = Element->Base.EndPosition;
        Result->Base.bNeedDataSizeUpdate = Element->Base.bNeedDataSizeUpdate;
    }
    return Result;
}